

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O1

shared_ptr<helics::helicsCLI11App> __thiscall
helics::apps::Recorder::buildArgParserApp(Recorder *this)

{
  shared_ptr<helics::CombinationFederate> *this_00;
  Option *pOVar1;
  App *pAVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  long in_RSI;
  shared_ptr<helics::helicsCLI11App> sVar4;
  _Any_data local_2d8;
  code *local_2c8;
  code *pcStack_2c0;
  shared_ptr<helics::CombinationFederate> *local_2b8;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  (this->super_App)._vptr_App = (_func_int **)0x0;
  this_00 = &(this->super_App).fed;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<helics::helicsCLI11App,std::allocator<helics::helicsCLI11App>,char_const(&)[42]>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00,(helicsCLI11App **)this,
             (allocator<helics::helicsCLI11App> *)&local_2d8,
             (char (*) [42])"Command line options for the Recorder App");
  pAVar2 = (App *)(this->super_App)._vptr_App;
  local_2b8 = this_00;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"--allow_iteration","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"allow iteration on values","");
  pOVar1 = CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
                     (pAVar2,&local_50,(bool *)(in_RSI + 0xa0),&local_70);
  CLI::Option::ignore_underscore<CLI::App>(pOVar1,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pAVar2 = (App *)(this->super_App)._vptr_App;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"--marker","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,
             "print a statement indicating time advancement every <arg> period during the simulation"
             ,"");
  CLI::App::
  add_option<TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_(CLI::detail::enabler)0>
            (pAVar2,&local_90,(TimeRepresentation<count_time<9,_long>_> *)(in_RSI + 0xa8),&local_b0)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  pAVar2 = (App *)(this->super_App)._vptr_App;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"--verbose","");
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,"print all value results to the screen","");
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar2,&local_d0,(bool *)(in_RSI + 0xa1),&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  pAVar2 = (App *)(this->super_App)._vptr_App;
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"--mapfile","");
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_130,"write progress to a map file for concurrent progress monitoring",
             "");
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar2,&local_110,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x298),
             &local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  pAVar2 = (App *)(this->super_App)._vptr_App;
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"--output,-o","");
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_170,"the output file for recording the data","");
  pOVar1 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar2,&local_150,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (in_RSI + 0x60),&local_170);
  CLI::Option::capture_default_str(pOVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  pAVar2 = (App *)(this->super_App)._vptr_App;
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"cloning","");
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1b0,
             "Options related to endpoint cloning operations and specifications","");
  pAVar2 = &CLI::App::add_option_group<CLI::Option_group>(pAVar2,&local_190,&local_1b0)->super_App;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"--clone","");
  pOVar1 = CLI::App::add_option<const_char[52],_(CLI::detail::enabler)0>
                     (pAVar2,&local_1d0,
                      (char (*) [52])"existing endpoints to clone all packets to and from");
  local_2d8._8_8_ = 0;
  pcStack_2c0 = CLI::std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Recorder.cpp:640:16)>
                ::_M_invoke;
  local_2c8 = CLI::std::
              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Recorder.cpp:640:16)>
              ::_M_manager;
  pOVar1 = CLI::Option::each(pOVar1,(function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                     *)&local_2d8);
  (pOVar1->super_OptionBase<CLI::Option>).delimiter_ = ',';
  pOVar1->type_size_max_ = 1;
  pOVar1->type_size_min_ = 1;
  pOVar1->expected_max_ = 0x20000000;
  if (local_2c8 != (code *)0x0) {
    (*local_2c8)(&local_2d8,&local_2d8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"--sourceclone","");
  pOVar1 = CLI::App::add_option<const_char[99],_(CLI::detail::enabler)0>
                     (pAVar2,&local_1f0,
                      (char (*) [99])
                      "existing endpoints to capture generated packets from, this argument may be specified multiple time"
                     );
  local_2d8._8_8_ = 0;
  pcStack_2c0 = CLI::std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Recorder.cpp:651:16)>
                ::_M_invoke;
  local_2c8 = CLI::std::
              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Recorder.cpp:651:16)>
              ::_M_manager;
  pOVar1 = CLI::Option::each(pOVar1,(function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                     *)&local_2d8);
  (pOVar1->super_OptionBase<CLI::Option>).delimiter_ = ',';
  pOVar1 = CLI::Option::ignore_underscore<CLI::App>(pOVar1,true);
  pOVar1->type_size_max_ = 1;
  pOVar1->type_size_min_ = 1;
  pOVar1->expected_max_ = 0x20000000;
  if (local_2c8 != (code *)0x0) {
    (*local_2c8)(&local_2d8,&local_2d8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"--destclone","");
  pOVar1 = CLI::App::add_option<const_char[133],_(CLI::detail::enabler)0>
                     (pAVar2,&local_210,
                      (char (*) [133])
                      "existing endpoints to capture all packets with the specified endpoint as a destination, this argument may be specified multiple time"
                     );
  local_2d8._8_8_ = 0;
  pcStack_2c0 = CLI::std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Recorder.cpp:660:16)>
                ::_M_invoke;
  local_2c8 = CLI::std::
              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Recorder.cpp:660:16)>
              ::_M_manager;
  pOVar1 = CLI::Option::each(pOVar1,(function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                     *)&local_2d8);
  (pOVar1->super_OptionBase<CLI::Option>).delimiter_ = ',';
  pOVar1 = CLI::Option::ignore_underscore<CLI::App>(pOVar1,true);
  pOVar1->type_size_max_ = 1;
  pOVar1->type_size_min_ = 1;
  pOVar1->expected_max_ = 0x20000000;
  if (local_2c8 != (code *)0x0) {
    (*local_2c8)(&local_2d8,&local_2d8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  pAVar2 = (App *)(this->super_App)._vptr_App;
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"capture_group","");
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_250,
             "Options related to capturing publications, endpoints, or federates","");
  pAVar2 = &CLI::App::add_option_group<CLI::Option_group>(pAVar2,&local_230,&local_250)->super_App;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_270,"--tag,--publication,--pub","");
  pOVar1 = CLI::App::add_option<const_char[81],_(CLI::detail::enabler)0>
                     (pAVar2,&local_270,
                      (char (*) [81])
                      "tags(publications) to record, this argument may be specified any number of times"
                     );
  local_2d8._8_8_ = 0;
  pcStack_2c0 = CLI::std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Recorder.cpp:672:16)>
                ::_M_invoke;
  local_2c8 = CLI::std::
              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Recorder.cpp:672:16)>
              ::_M_manager;
  pOVar1 = CLI::Option::each(pOVar1,(function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                     *)&local_2d8);
  pOVar1->type_size_max_ = 1;
  pOVar1->type_size_min_ = 1;
  pOVar1->expected_max_ = 0x20000000;
  if (local_2c8 != (code *)0x0) {
    (*local_2c8)(&local_2d8,&local_2d8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"--endpoints","");
  pOVar1 = CLI::App::add_option<const_char[67],_(CLI::detail::enabler)0>
                     (pAVar2,&local_290,
                      (char (*) [67])
                      "endpoints to capture, this argument may be specified multiple time");
  local_2d8._8_8_ = 0;
  pcStack_2c0 = CLI::std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Recorder.cpp:683:16)>
                ::_M_invoke;
  local_2c8 = CLI::std::
              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Recorder.cpp:683:16)>
              ::_M_manager;
  pOVar1 = CLI::Option::each(pOVar1,(function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                     *)&local_2d8);
  pOVar1->type_size_max_ = 1;
  pOVar1->type_size_min_ = 1;
  pOVar1->expected_max_ = 0x20000000;
  if (local_2c8 != (code *)0x0) {
    (*local_2c8)(&local_2d8,&local_2d8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"--capture","");
  pOVar1 = CLI::App::add_option<const_char[139],_(CLI::detail::enabler)0>
                     (pAVar2,&local_2b0,
                      (char (*) [139])
                      "capture all the publications of a particular federate capture=\"fed1;fed2\"  supports multiple arguments or a semicolon/comma separated list"
                     );
  local_2d8._8_8_ = 0;
  pcStack_2c0 = CLI::std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Recorder.cpp:695:16)>
                ::_M_invoke;
  local_2c8 = CLI::std::
              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Recorder.cpp:695:16)>
              ::_M_manager;
  pOVar1 = CLI::Option::each(pOVar1,(function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                     *)&local_2d8);
  pOVar1->type_size_max_ = 1;
  pOVar1->type_size_min_ = 1;
  pOVar1->expected_max_ = 0x20000000;
  _Var3._M_pi = extraout_RDX;
  if (local_2c8 != (code *)0x0) {
    (*local_2c8)(&local_2d8,&local_2d8,__destroy_functor);
    _Var3._M_pi = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    _Var3._M_pi = extraout_RDX_01;
  }
  sVar4.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar4.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<helics::helicsCLI11App>)
         sVar4.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<helicsCLI11App> Recorder::buildArgParserApp()
{
    using gmlc::utilities::stringOps::removeQuotes;
    using gmlc::utilities::stringOps::splitlineQuotes;

    auto app = std::make_shared<helicsCLI11App>("Command line options for the Recorder App");
    app->add_flag("--allow_iteration", allow_iteration, "allow iteration on values")
        ->ignore_underscore();
    app->add_option(
        "--marker",
        nextPrintTimeStep,
        "print a statement indicating time advancement every <arg> period during the simulation");
    app->add_flag("--verbose", verbose, "print all value results to the screen");
    app->add_option("--mapfile",
                    mapfile,
                    "write progress to a map file for concurrent progress monitoring");

    app->add_option("--output,-o", outFileName, "the output file for recording the data")
        ->capture_default_str();

    auto* clone_group =
        app->add_option_group("cloning",
                              "Options related to endpoint cloning operations and specifications");
    clone_group->add_option("--clone", "existing endpoints to clone all packets to and from")
        ->each([this](const std::string& clone) {
            addDestEndpointClone(clone);
            addSourceEndpointClone(clone);
        })
        ->delimiter(',')
        ->type_size(-1);

    clone_group
        ->add_option(
            "--sourceclone",
            "existing endpoints to capture generated packets from, this argument may be specified multiple time")
        ->each([this](const std::string& clone) { addSourceEndpointClone(clone); })
        ->delimiter(',')
        ->ignore_underscore()
        ->type_size(-1);

    clone_group
        ->add_option("--destclone",
                     "existing endpoints to capture all packets with the specified endpoint as a "
                     "destination, this argument may be specified multiple time")
        ->each([this](const std::string& clone) { addSourceEndpointClone(clone); })
        ->delimiter(',')
        ->ignore_underscore()
        ->type_size(-1);

    auto* capture_group =
        app->add_option_group("capture_group",
                              "Options related to capturing publications, endpoints, or federates");
    capture_group
        ->add_option(
            "--tag,--publication,--pub",
            "tags(publications) to record, this argument may be specified any number of times")
        ->each([this](const std::string& tag) {
            auto taglist = splitlineQuotes(tag);
            for (const auto& tagname : taglist) {
                subkeys.emplace(removeQuotes(tagname), -1);
            }
        })
        ->type_size(-1);

    capture_group
        ->add_option("--endpoints",
                     "endpoints to capture, this argument may be specified multiple time")
        ->each([this](const std::string& ept) {
            auto eptlist = splitlineQuotes(ept);
            for (const auto& eptname : eptlist) {
                eptNames.emplace(removeQuotes(eptname), -1);
            }
        })
        ->type_size(-1);

    capture_group
        ->add_option("--capture",
                     "capture all the publications of a particular federate capture=\"fed1;fed2\"  "
                     "supports multiple arguments or a semicolon/comma separated list")
        ->each([this](const std::string& capt) {
            auto captFeds = splitlineQuotes(capt);
            for (auto& captFed : captFeds) {
                auto actCapt = removeQuotes(captFed);
                captureInterfaces.push_back(actCapt);
            }
        })
        ->type_size(-1);

    return app;
}